

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

symbol * evaluate_assignment(dmr_C *C,expression *expr)

{
  expression **rp;
  byte bVar1;
  uint op;
  expression_list *left;
  expression_list *type;
  int iVar2;
  expression_list *sym;
  expression_list *sym_00;
  expression_list *peVar3;
  expression *peVar4;
  char *pcVar5;
  char *pcVar6;
  uint lclass;
  uint rclass;
  
  left = (expr->field_5).expr_list;
  if ((*(char *)left != '\t') || (*(int *)&left->field_0x4 != 0x2a)) {
    pcVar5 = "not an lvalue";
    goto LAB_0010bd8e;
  }
  type = left->next_;
  rp = &(expr->field_5).field_6.right;
  if (expr->op == 0x3d) {
    iVar2 = compatible_assignment_types(C,expr,(symbol *)type,rp,"assignment");
    if (iVar2 == 0) {
      return (symbol *)0x0;
    }
    goto LAB_0010c064;
  }
  bVar1 = *(byte *)type;
  sym = type;
  if (bVar1 == 3) {
    sym = (expression_list *)type->list_[0xc];
    bVar1 = *(byte *)sym;
  }
  peVar3 = (expression_list *)(*rp)->ctype;
  if (bVar1 == 0xb) {
    sym = (expression_list *)dmrC_evaluate_expression(C,sym->list_[0x12]);
    if (sym == (expression_list *)0x0) {
      sym = (expression_list *)&C->S->bad_ctype;
    }
    else if (*(char *)sym == '\x03') {
      sym = (expression_list *)sym->list_[0xc];
    }
  }
  bVar1 = *(byte *)sym;
  if (bVar1 == 9) {
    sym = (expression_list *)sym->list_[0xc];
    bVar1 = *(byte *)sym;
  }
  if (bVar1 == 2) {
    if ((symbol *)sym->list_[0xc] == &C->S->int_type) {
      lclass = 1;
    }
    else {
      if ((symbol *)sym->list_[0xc] != &C->S->fp_type) goto LAB_0010be42;
      lclass = 9;
    }
  }
  else {
LAB_0010be42:
    lclass = classify_type::type_class[(uint)bVar1];
  }
  bVar1 = *(byte *)peVar3;
  sym_00 = peVar3;
  if (bVar1 == 3) {
    sym_00 = (expression_list *)peVar3->list_[0xc];
    bVar1 = *(byte *)sym_00;
  }
  if (bVar1 == 0xb) {
    sym_00 = (expression_list *)dmrC_evaluate_expression(C,sym_00->list_[0x12]);
    if (sym_00 == (expression_list *)0x0) {
      sym_00 = (expression_list *)&C->S->bad_ctype;
    }
    else if (*(char *)sym_00 == '\x03') {
      sym_00 = (expression_list *)sym_00->list_[0xc];
    }
  }
  bVar1 = *(byte *)sym_00;
  if (bVar1 == 9) {
    sym_00 = (expression_list *)sym_00->list_[0xc];
    bVar1 = *(byte *)sym_00;
  }
  if (bVar1 == 2) {
    if ((symbol *)sym_00->list_[0xc] == &C->S->int_type) {
      rclass = 1;
    }
    else {
      if ((symbol *)sym_00->list_[0xc] != &C->S->fp_type) goto LAB_0010befa;
      rclass = 9;
    }
  }
  else {
LAB_0010befa:
    rclass = classify_type::type_class[(uint)bVar1];
  }
  op = expr->op;
  if ((lclass & rclass & 1) == 0) {
    if ((lclass == 0x10) && ((rclass & 9) == 1)) {
      if ((op & 0xfffffffd) == 0x100) {
        if ((rclass & 4) != 0) {
          peVar4 = *rp;
          if ((rclass & 0x40) != 0) {
            sym_00 = (expression_list *)sym_00->list_[0xc];
          }
          pcVar5 = dmrC_show_typename(C,(symbol *)sym_00);
          dmrC_warning(C,peVar4->pos,"%s degrades to integer",pcVar5);
          sym_00 = (expression_list *)sym_00->list_[0xc];
        }
        evaluate_ptr_add(C,expr,(symbol *)sym_00);
        goto LAB_0010c064;
      }
      pcVar5 = "invalid pointer assignment";
      goto LAB_0010bd8e;
    }
  }
  else if (((lclass & 8) == 0) || ((op - 0x100 < 7 && ((0x65U >> (op - 0x100 & 0x1f) & 1) != 0)))) {
    if ((lclass & 4) == 0) {
      if ((rclass & 4) != 0) {
LAB_0010c088:
        if (sym == sym_00) goto LAB_0010c064;
LAB_0010c08d:
        pcVar5 = dmrC_show_special(C,op);
        dmrC_warning(C,expr->pos,"invalid assignment: %s",pcVar5);
        pcVar5 = dmrC_show_typename(C,(symbol *)sym);
        dmrC_info(C,expr->pos,"   left side has type %s",pcVar5);
        pcVar5 = dmrC_show_typename(C,(symbol *)sym_00);
        dmrC_info(C,expr->pos,"   right side has type %s",pcVar5);
LAB_0010c12e:
        peVar4 = cast_to(C,(expr->field_5).field_6.right,(symbol *)type);
        (expr->field_5).field_6.right = peVar4;
        return (symbol *)0x0;
      }
      peVar3 = (expression_list *)
               usual_conversions(C,op,(expr->field_5).field_3.unop,(expr->field_5).field_6.right,
                                 lclass,rclass,(symbol *)type,(symbol *)peVar3);
    }
    else {
      iVar2 = restricted_binop(op);
      if (iVar2 == 0) {
        pcVar5 = dmrC_show_special(C,op);
        pcVar6 = dmrC_show_typename(C,(symbol *)sym);
        dmrC_warning(C,expr->pos,"bad assignment (%s) to %s",pcVar5,pcVar6);
        goto LAB_0010c12e;
      }
      if (((rclass & 0x40) == 0) || (peVar3 = type, (expression_list *)sym_00->list_[0xc] != sym)) {
        if (*(char *)*rp != '\x01') goto LAB_0010c088;
        if ((sym == sym_00) || (((*rp)->field_5).field_0.value == 0)) goto LAB_0010c064;
        goto LAB_0010c08d;
      }
    }
    peVar4 = cast_to(C,*rp,(symbol *)peVar3);
    *rp = peVar4;
LAB_0010c064:
    evaluate_assign_to(C,(expression *)left,(symbol *)type->list_[8]);
    expr->ctype = (symbol *)type;
    return (symbol *)type;
  }
  pcVar5 = "invalid assignment";
LAB_0010bd8e:
  dmrC_expression_error(C,expr,pcVar5);
  return (symbol *)0x0;
}

Assistant:

static struct symbol *evaluate_assignment(struct dmr_C *C, struct expression *expr)
{
	struct expression *left = expr->left;
	struct expression *where = expr;
	struct symbol *ltype;

	if (!lvalue_expression(C, left)) {
		dmrC_expression_error(C, expr, "not an lvalue");
		return NULL;
	}

	ltype = left->ctype;

	if (expr->op != '=') {
		if (!evaluate_assign_op(C, expr))
			return NULL;
	} else {
		if (!compatible_assignment_types(C, where, ltype, &expr->right, "assignment"))
			return NULL;
	}

	evaluate_assign_to(C, left, ltype);

	expr->ctype = ltype;
	return ltype;
}